

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

void Rml::Parse::NotEqual(DataParser *parser)

{
  DataParser *this;
  Variant local_38;
  DataParser *local_10;
  DataParser *parser_local;
  
  local_10 = parser;
  DataParser::Match(parser,'!',false);
  DataParser::Match(local_10,'=',true);
  DataParser::Push(local_10);
  Additive(local_10);
  DataParser::Pop(local_10,L);
  this = local_10;
  Variant::Variant(&local_38);
  DataParser::Emit(this,NotEqual,&local_38);
  Variant::~Variant(&local_38);
  return;
}

Assistant:

static void NotEqual(DataParser& parser)
	{
		parser.Match('!', false);
		parser.Match('=');
		parser.Push();
		Additive(parser);
		parser.Pop(Register::L);
		parser.Emit(Instruction::NotEqual);
	}